

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::removeEdge(Graph *this,int src_idx,int dst_idx)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  Node *pNVar4;
  Node *pNVar5;
  _Base_ptr p_Var6;
  iterator __position;
  iterator __position_00;
  
  pNVar4 = getNode(this,src_idx);
  pNVar5 = getNode(this,dst_idx);
  if (pNVar5 == (Node *)0x0 || pNVar4 == (Node *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Index not found. Couldn\'t remove edge\n",0x26);
    return;
  }
  p_Var1 = &(pNVar4->edges)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (pNVar4->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(Node **)(p_Var3 + 1) < pNVar5]) {
    if (*(Node **)(p_Var3 + 1) >= pNVar5) {
      p_Var6 = p_Var3;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (__position._M_node = p_Var6, pNVar5 < *(Node **)(p_Var6 + 1))) {
    __position._M_node = &p_Var1->_M_header;
  }
  p_Var2 = &(pNVar5->edges)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (pNVar5->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var2->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(Node **)(p_Var3 + 1) < pNVar4]) {
    if (*(Node **)(p_Var3 + 1) >= pNVar4) {
      p_Var6 = p_Var3;
    }
  }
  __position_00._M_node = &p_Var2->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var2) &&
     (__position_00._M_node = p_Var6, pNVar4 < *(Node **)(p_Var6 + 1))) {
    __position_00._M_node = &p_Var2->_M_header;
  }
  if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
     ((_Rb_tree_header *)__position_00._M_node != p_Var2)) {
    std::
    _Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
    ::erase_abi_cxx11_((_Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
                        *)&pNVar4->edges,__position);
    std::
    _Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
    ::erase_abi_cxx11_((_Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
                        *)&pNVar5->edges,__position_00);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Index not found. Couldn\'t remove edge\n");
  exit(0);
}

Assistant:

void Graph::removeEdge(int src_idx, int dst_idx) {
    auto src_exist = getNode(src_idx);
    auto dst_exist = getNode(dst_idx);

    if(src_exist && dst_exist) {
        auto it1 = src_exist->edges.find(dst_exist);
        auto it2 = dst_exist->edges.find(src_exist);

        if(it1 != src_exist->edges.end() and
            it2 != dst_exist->edges.end()) {
            src_exist->edges.erase(it1);
            dst_exist->edges.erase(it2);
        } else {
            std::cerr << "Index not found. Couldn't remove edge\n";
            exit(0);
        }
    } else {
        std::cerr << "Index not found. Couldn't remove edge\n";
        //exit(0);
    }
}